

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_>::
TypedAttributeWithFallback
          (TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_> *this,
          Animatable<tinyusdz::value::color3f> *fallback)

{
  Animatable<tinyusdz::value::color3f> *fallback_local;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::value::color3f>_> *this_local;
  
  AttrMetas::AttrMetas(&this->_metas);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector(&this->_paths);
  nonstd::optional_lite::optional<tinyusdz::Animatable<tinyusdz::value::color3f>_>::optional
            (&this->_attrib);
  this->_empty = false;
  Animatable<tinyusdz::value::color3f>::Animatable(&this->_fallback,fallback);
  this->_blocked = false;
  return;
}

Assistant:

TypedAttributeWithFallback(const T &fallback) : _fallback(fallback) {}